

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::benchmarkEnded(ConsoleReporter *this,BenchmarkStats *stats)

{
  TablePrinter *pTVar1;
  long in_RSI;
  TablePrinter *in_RDI;
  Duration average;
  Duration *in_stack_ffffffffffffffc8;
  Duration local_20 [2];
  
  anon_unknown_1::Duration::Duration
            (local_20,*(ulong *)(in_RSI + 0x28) / *(ulong *)(in_RSI + 0x20),Auto);
  clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::operator*
            ((unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_> *)in_RDI);
  pTVar1 = Catch::operator<<(in_RDI,&in_stack_ffffffffffffffc8->m_inNanoseconds);
  Catch::operator<<(pTVar1);
  pTVar1 = Catch::operator<<(in_RDI,&in_stack_ffffffffffffffc8->m_inNanoseconds);
  Catch::operator<<(pTVar1);
  pTVar1 = Catch::operator<<(in_RDI,in_stack_ffffffffffffffc8);
  Catch::operator<<(pTVar1);
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats const& stats) {
    Duration average(stats.elapsedTimeInNanoseconds / stats.iterations);
    (*m_tablePrinter)
        << stats.iterations << ColumnBreak()
        << stats.elapsedTimeInNanoseconds << ColumnBreak()
        << average << ColumnBreak();
}